

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

bool __thiscall
CodeGenGenericContext::IsLastRegVmRegisterUse
          (CodeGenGenericContext *this,uchar regId,uchar *instRegKillInfo)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  uchar *puVar4;
  long lVar5;
  bool bVar6;
  
  bVar1 = *instRegKillInfo;
  if (bVar1 == 0) {
    return false;
  }
  uVar3 = (uint)(bVar1 >> 4);
  puVar4 = instRegKillInfo + 1;
  do {
    bVar6 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar6) {
      lVar5 = 0;
      while( true ) {
        bVar6 = (bVar1 & 0xf) != (uint)lVar5;
        if (!bVar6) {
          return bVar6;
        }
        if (puVar4[lVar5] == regId) break;
        lVar5 = lVar5 + 1;
      }
      return bVar6;
    }
    uVar2 = *puVar4;
    puVar4 = puVar4 + 1;
  } while (uVar2 != regId);
  return true;
}

Assistant:

bool CodeGenGenericContext::IsLastRegVmRegisterUse(unsigned char regId, unsigned char *instRegKillInfo)
{
	if(unsigned regKillCounts = *instRegKillInfo)
	{
		instRegKillInfo++;

		unsigned preKillCount = (regKillCounts >> 4);
		unsigned postKillCount = (regKillCounts & 0xf);

		for(unsigned k = 0; k < preKillCount; k++)
		{
			if(regId == *instRegKillInfo++)
				return true;
		}

		for(unsigned k = 0; k < postKillCount; k++)
		{
			if(regId == *instRegKillInfo++)
				return true;
		}
	}

	return false;
}